

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_sse4.c
# Opt level: O3

void av1_txb_init_levels_sse4_1(tran_low_t *coeff,int width,int height,uint8_t *levels)

{
  uint uVar1;
  uint8_t *puVar2;
  int iVar3;
  uint8_t *puVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  uVar1 = height + 4;
  lVar6 = (long)(int)(uVar1 * width);
  puVar2 = levels + lVar6;
  puVar4 = puVar2 + (height * 4 + 0x10);
  if (puVar2 + (height * 4 + 0x10) <= levels + lVar6 + 0x10) {
    puVar4 = levels + lVar6 + 0x10;
  }
  memset(puVar2,0,((ulong)(puVar4 + (~(ulong)levels - lVar6)) & 0xfffffffffffffff0) + 0x10);
  if (height == 8) {
    iVar3 = 1;
    if (1 < width) {
      iVar3 = width;
    }
    do {
      auVar8 = packssdw(*(undefined1 (*) [16])coeff,*(undefined1 (*) [16])((long)coeff + 0x10));
      auVar8 = pabsw(auVar8,auVar8);
      auVar8 = packsswb(auVar8,(undefined1  [16])0x0);
      *(undefined1 (*) [16])levels = auVar8;
      levels = *(undefined1 (*) [16])levels + uVar1;
      coeff = (tran_low_t *)((long)coeff + 0x20);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  else if (height == 4) {
    lVar6 = 0;
    do {
      auVar8 = packssdw(*(undefined1 (*) [16])coeff,*(undefined1 (*) [16])((long)coeff + 0x10));
      auVar8 = pabsw(auVar8,auVar8);
      auVar8 = packsswb(auVar8,auVar8);
      auVar8 = pmovzxdq(auVar8,auVar8);
      *(undefined1 (*) [16])(levels + lVar6 * 8) = auVar8;
      coeff = (tran_low_t *)((long)coeff + 0x20);
      lVar6 = lVar6 + 2;
    } while ((int)lVar6 < width);
  }
  else {
    iVar3 = 1;
    if (1 < width) {
      iVar3 = width;
    }
    iVar5 = 0;
    do {
      lVar6 = 0;
      lVar7 = 0;
      do {
        auVar8 = packssdw(*(undefined1 (*) [16])(coeff + lVar7),
                          *(undefined1 (*) [16])(coeff + lVar7 + 4));
        auVar9 = packssdw(*(undefined1 (*) [16])(coeff + lVar7 + 8),
                          *(undefined1 (*) [16])(coeff + lVar7 + 0xc));
        auVar8 = pabsw(auVar8,auVar8);
        auVar9 = pabsw(auVar9,auVar9);
        auVar8 = packsswb(auVar8,auVar9);
        *(undefined1 (*) [16])(levels + lVar7) = auVar8;
        lVar7 = lVar7 + 0x10;
        lVar6 = lVar6 + 0x40;
      } while (lVar7 < height);
      puVar2 = levels + height;
      puVar2[0] = '\0';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      levels = levels + (int)uVar1;
      iVar5 = iVar5 + 1;
      coeff = (tran_low_t *)((long)coeff + lVar6);
    } while (iVar5 != iVar3);
  }
  return;
}

Assistant:

void av1_txb_init_levels_sse4_1(const tran_low_t *const coeff, const int width,
                                const int height, uint8_t *const levels) {
  const int stride = height + TX_PAD_HOR;
  const __m128i zeros = _mm_setzero_si128();

  const int32_t bottom_len = sizeof(*levels) * (TX_PAD_BOTTOM * stride);
  uint8_t *bottom_buf = levels + stride * width;
  uint8_t *bottom_buf_end = bottom_buf + bottom_len;
  do {
    _mm_storeu_si128((__m128i *)(bottom_buf), zeros);
    bottom_buf += 16;
  } while (bottom_buf < bottom_buf_end);

  int i = 0;
  uint8_t *ls = levels;
  const tran_low_t *cf = coeff;
  if (height == 4) {
    do {
      const __m128i coeffA = xx_loadu_128(cf);
      const __m128i coeffB = xx_loadu_128(cf + 4);
      const __m128i coeffAB = _mm_packs_epi32(coeffA, coeffB);
      const __m128i absAB = _mm_abs_epi16(coeffAB);
      const __m128i absAB8 = _mm_packs_epi16(absAB, zeros);
      const __m128i lsAB = _mm_unpacklo_epi32(absAB8, zeros);
      xx_storeu_128(ls, lsAB);
      ls += (stride << 1);
      cf += (height << 1);
      i += 2;
    } while (i < width);
  } else if (height == 8) {
    do {
      const __m128i coeffA = xx_loadu_128(cf);
      const __m128i coeffB = xx_loadu_128(cf + 4);
      const __m128i coeffAB = _mm_packs_epi32(coeffA, coeffB);
      const __m128i absAB = _mm_abs_epi16(coeffAB);
      const __m128i absAB8 = _mm_packs_epi16(absAB, zeros);
      xx_storeu_128(ls, absAB8);
      ls += stride;
      cf += height;
      i += 1;
    } while (i < width);
  } else {
    do {
      int j = 0;
      do {
        const __m128i coeffA = xx_loadu_128(cf);
        const __m128i coeffB = xx_loadu_128(cf + 4);
        const __m128i coeffC = xx_loadu_128(cf + 8);
        const __m128i coeffD = xx_loadu_128(cf + 12);
        const __m128i coeffAB = _mm_packs_epi32(coeffA, coeffB);
        const __m128i coeffCD = _mm_packs_epi32(coeffC, coeffD);
        const __m128i absAB = _mm_abs_epi16(coeffAB);
        const __m128i absCD = _mm_abs_epi16(coeffCD);
        const __m128i absABCD = _mm_packs_epi16(absAB, absCD);
        xx_storeu_128(ls + j, absABCD);
        j += 16;
        cf += 16;
      } while (j < height);
      *(int32_t *)(ls + height) = 0;
      ls += stride;
      i += 1;
    } while (i < width);
  }
}